

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O0

int32_t uloc_minimizeSubtags_63
                  (char *localeID,char *minimizedLocaleID,int32_t minimizedLocaleIDCapacity,
                  UErrorCode *err)

{
  UBool UVar1;
  char local_d8 [8];
  char localeBuffer [157];
  UErrorCode *err_local;
  int32_t minimizedLocaleIDCapacity_local;
  char *minimizedLocaleID_local;
  char *localeID_local;
  
  UVar1 = do_canonicalize(localeID,local_d8,0x9d,err);
  if (UVar1 == '\0') {
    localeID_local._4_4_ = -1;
  }
  else {
    localeID_local._4_4_ =
         _uloc_minimizeSubtags(local_d8,minimizedLocaleID,minimizedLocaleIDCapacity,err);
  }
  return localeID_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_minimizeSubtags(const char*    localeID,
         char* minimizedLocaleID,
         int32_t minimizedLocaleIDCapacity,
         UErrorCode* err)
{
    char localeBuffer[ULOC_FULLNAME_CAPACITY];

    if (!do_canonicalize(
        localeID,
        localeBuffer,
        sizeof(localeBuffer),
        err)) {
        return -1;
    }
    else {
        return _uloc_minimizeSubtags(
                    localeBuffer,
                    minimizedLocaleID,
                    minimizedLocaleIDCapacity,
                    err);
    }    
}